

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::fragmentsPassed(FunctionalTest *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 *puVar2;
  GLint result;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  result = -1;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa10))(this->m_qo_id,0x8866,&result);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetQueryObjectiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,599);
  if (result != -1) {
    return 0 < result;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

bool gl4cts::ConditionalRenderInverted::FunctionalTest::fragmentsPassed()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch result. */
	glw::GLint result = -1;

	gl.getQueryObjectiv(m_qo_id, GL_QUERY_RESULT, &result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectiv() call failed.");

	/* Check for unusual errors. */
	if (-1 == result)
	{
		throw 0;
	}

	/* Return results. */
	return (result > 0);
}